

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_curves.c
# Opt level: O0

int ecp_mod_p448(mbedtls_mpi *N)

{
  mbedtls_mpi_uint *pmVar1;
  undefined1 local_d8 [8];
  mbedtls_mpi_uint Qp [7];
  undefined8 local_98;
  mbedtls_mpi_uint Mp [8];
  mbedtls_mpi Q;
  mbedtls_mpi M;
  size_t i;
  int ret;
  mbedtls_mpi *N_local;
  
  if (N->n < 8) {
    N_local._4_4_ = 0;
  }
  else {
    Q.p._0_4_ = 1;
    pmVar1 = (mbedtls_mpi_uint *)(N->n - 7);
    if (pmVar1 < (mbedtls_mpi_uint *)0x8) {
      memset(&local_98,0,0x40);
      memcpy(&local_98,N->p + 7,(long)pmVar1 * 8);
      for (M.p = (mbedtls_mpi_uint *)0x7; M.p < (mbedtls_mpi_uint *)N->n;
          M.p = (mbedtls_mpi_uint *)((long)M.p + 1)) {
        N->p[(long)M.p] = 0;
      }
      i._4_4_ = mbedtls_mpi_add_mpi(N,N,(mbedtls_mpi *)&Q.p);
      if (i._4_4_ == 0) {
        Mp[7] = CONCAT44(Q.p._4_4_,Q.p._0_4_);
        Q.n = (size_t)local_d8;
        Q._0_8_ = pmVar1;
        memcpy(local_d8,&local_98,0x38);
        i._4_4_ = mbedtls_mpi_shift_r((mbedtls_mpi *)(Mp + 7),0xe0);
        if ((i._4_4_ == 0) &&
           (i._4_4_ = mbedtls_mpi_add_mpi(N,N,(mbedtls_mpi *)(Mp + 7)), i._4_4_ == 0)) {
          Mp[2] = Mp[2] & 0xffffffff;
          for (M.p = (mbedtls_mpi_uint *)0x4; M.p < pmVar1;
              M.p = (mbedtls_mpi_uint *)((long)M.p + 1)) {
            Mp[(long)M.p + -1] = 0;
          }
          i._4_4_ = mbedtls_mpi_add_mpi((mbedtls_mpi *)&Q.p,(mbedtls_mpi *)&Q.p,
                                        (mbedtls_mpi *)(Mp + 7));
          if ((i._4_4_ == 0) &&
             (i._4_4_ = mbedtls_mpi_shift_l((mbedtls_mpi *)&Q.p,0xe0), i._4_4_ == 0)) {
            i._4_4_ = mbedtls_mpi_add_mpi(N,N,(mbedtls_mpi *)&Q.p);
          }
        }
      }
      N_local._4_4_ = i._4_4_;
    }
    else {
      N_local._4_4_ = -0x4f80;
    }
  }
  return N_local._4_4_;
}

Assistant:

static int ecp_mod_p448( mbedtls_mpi *N )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t i;
    mbedtls_mpi M, Q;
    mbedtls_mpi_uint Mp[P448_WIDTH + 1], Qp[P448_WIDTH];

    if( N->n <= P448_WIDTH )
        return( 0 );

    /* M = A1 */
    M.s = 1;
    M.n = N->n - ( P448_WIDTH );
    if( M.n > P448_WIDTH )
        /* Shouldn't be called with N larger than 2^896! */
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );
    M.p = Mp;
    memset( Mp, 0, sizeof( Mp ) );
    memcpy( Mp, N->p + P448_WIDTH, M.n * sizeof( mbedtls_mpi_uint ) );

    /* N = A0 */
    for( i = P448_WIDTH; i < N->n; i++ )
        N->p[i] = 0;

    /* N += A1 */
    MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( N, N, &M ) );

    /* Q = B1, N += B1 */
    Q = M;
    Q.p = Qp;
    memcpy( Qp, Mp, sizeof( Qp ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &Q, 224 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( N, N, &Q ) );

    /* M = (B0 + B1) * 2^224, N += M */
    if( sizeof( mbedtls_mpi_uint ) > 4 )
        Mp[P224_WIDTH_MIN] &= ( (mbedtls_mpi_uint)-1 ) >> ( P224_UNUSED_BITS );
    for( i = P224_WIDTH_MAX; i < M.n; ++i )
        Mp[i] = 0;
    MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( &M, &M, &Q ) );
    M.n = P448_WIDTH + 1; /* Make room for shifted carry bit from the addition */
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l( &M, 224 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( N, N, &M ) );

cleanup:
    return( ret );
}